

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void quickSort_recursive<int>(vector<int,_std::allocator<int>_> *vec,int left,int right)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  undefined4 local_24;
  undefined4 local_20;
  int end;
  int start;
  int pivot;
  int right_local;
  int left_local;
  vector<int,_std::allocator<int>_> *vec_local;
  
  if (left < right) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](vec,(long)left);
    iVar1 = *pvVar3;
    local_24 = right;
    local_20 = left;
    while (local_20 < local_24) {
      while( true ) {
        bVar2 = false;
        if (local_20 < local_24) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](vec,(long)local_24);
          bVar2 = iVar1 < *pvVar3;
        }
        if (!bVar2) break;
        local_24 = local_24 + -1;
      }
      if (local_20 < local_24) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](vec,(long)local_24);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](vec,(long)local_20);
        std::swap<int>(pvVar3,pvVar4);
        local_20 = local_20 + 1;
      }
      while( true ) {
        bVar2 = false;
        if (local_20 < local_24) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](vec,(long)local_20);
          bVar2 = *pvVar3 < iVar1;
        }
        if (!bVar2) break;
        local_20 = local_20 + 1;
      }
      if (local_20 < local_24) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](vec,(long)local_20);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](vec,(long)local_24);
        std::swap<int>(pvVar3,pvVar4);
        local_24 = local_24 + -1;
      }
    }
    quickSort_recursive<int>(vec,left,local_20 + -1);
    quickSort_recursive<int>(vec,local_20 + 1,right);
  }
  return;
}

Assistant:

void quickSort_recursive(vector<T>& vec, int left, int right)
{
    //若数组为空，算法结束
    if (left >= right)
    {
        return;
    }
    int pivot = vec[left];  //设置基准点为首位的值
    int start = left;   //设置左边的哨兵
    int end = right;    //设置右边的哨兵
    //只要左哨兵小于右哨兵，说明没有遍历完，算法继续
    while (start < end)
    {
        //从右往左寻找小于基准点的值。start < end 是为了避免基准点右边的值全部大于基准点，如3, 7, 6, 5。防止end越界访问
        while (start < end && vec[end] > pivot)
        {
            end--;
        }
        //上述循环退出，说明1、start >= end或则2、vecp[end] < pivot
        //此判断为了防止第一种情况，保证是第二种情况
        if (start < end)
        {
            //交换基准点和符合条件的值
            swap(vec[end], vec[start]);
            //此时start处的值已为小于基准点的值，所以直接从下一位开始遍历
            start++;
        }
        //从左往右寻找大于基准点的值
        while (start < end && vec[start] < pivot)
        {
            start++;
        }
        if (start < end)
        {
            swap(vec[start], vec[end]);
            end--;
        }
    }
    //进入递归,已经就位的基准点将数组分为两部分，分别对其进行快速排序。
    //此时start == end,所以end -1 或者 start - 1都可以。下同理
    quickSort_recursive(vec, left, start - 1);
    quickSort_recursive(vec, start + 1, right);
}